

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

int remove(char *__filename)

{
  ulong *puVar1;
  svm_example *this;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  ulong in_RSI;
  ulong uVar5;
  ulong uVar6;
  ostream *this_00;
  
  puVar1 = *(ulong **)(__filename + 0x38);
  if (*puVar1 <= in_RSI) {
    this_00 = (ostream *)(*(long *)(__filename + 0x88) + 0xe0);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"Internal error at ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
    plVar3 = (long *)std::ostream::operator<<(this_00,0x1cd);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  this = *(svm_example **)(puVar1[1] + in_RSI * 8);
  uVar4 = in_RSI;
  if (in_RSI < *puVar1 - 1) {
    do {
      *(undefined8 *)(puVar1[1] + uVar4 * 8) = *(undefined8 *)(puVar1[1] + 8 + uVar4 * 8);
      *(undefined4 *)(puVar1[5] + uVar4 * 4) = *(undefined4 *)(puVar1[5] + 4 + uVar4 * 4);
      *(undefined4 *)(puVar1[9] + uVar4 * 4) = *(undefined4 *)(puVar1[9] + 4 + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *puVar1 - 1);
  }
  svm_example::~svm_example(this);
  free(this);
  puVar1[2] = puVar1[2] - 8;
  puVar1[6] = puVar1[6] - 4;
  puVar1[10] = puVar1[10] - 4;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uVar4 = 0;
    do {
      plVar3 = *(long **)(puVar1[1] + uVar4 * 8);
      uVar5 = plVar3[1] - *plVar3 >> 2;
      if (in_RSI < uVar5) {
        uVar6 = in_RSI + 1;
        if (in_RSI < uVar5 - 1) {
          do {
            *(undefined4 *)(*plVar3 + -4 + uVar6 * 4) = *(undefined4 *)(*plVar3 + uVar6 * 4);
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        plVar3[1] = plVar3[1] + -4;
        iVar2 = iVar2 + -1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *puVar1);
  }
  return iVar2;
}

Assistant:

int remove(svm_params& params, size_t svi)
{
  svm_model* model = params.model;
  if (svi >= model->num_support)
    params.all->trace_message << "Internal error at " << __FILE__ << ":" << __LINE__ << endl;
  // shift params fields
  svm_example* svi_e = model->support_vec[svi];
  for (size_t i = svi; i < model->num_support - 1; ++i)
  {
    model->support_vec[i] = model->support_vec[i + 1];
    model->alpha[i] = model->alpha[i + 1];
    model->delta[i] = model->delta[i + 1];
  }
  svi_e->~svm_example();
  free(svi_e);
  model->support_vec.pop();
  model->alpha.pop();
  model->delta.pop();
  model->num_support--;
  // shift cache
  int alloc = 0;
  for (size_t j = 0; j < model->num_support; j++)
  {
    svm_example* e = model->support_vec[j];
    size_t rowsize = e->krow.size();
    if (svi < rowsize)
    {
      for (size_t i = svi; i < rowsize - 1; i++) e->krow[i] = e->krow[i + 1];
      e->krow.pop();
      alloc -= 1;
    }
  }
  return alloc;
}